

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  stCoEpoll_t *ctx;
  stCoRoutine_t *local_e0;
  stCoRoutine_t *co;
  __pid_t local_d0;
  int i;
  pid_t pid;
  int k;
  sigaction sa;
  int proccnt;
  int cnt;
  stEndPoint endpoint;
  char **argv_local;
  int argc_local;
  
  _proccnt = argv[1];
  endpoint._8_8_ = argv;
  iVar1 = atoi(argv[2]);
  endpoint.ip._0_2_ = (undefined2)iVar1;
  sa.sa_restorer._4_4_ = atoi(*(char **)(endpoint._8_8_ + 0x18));
  sa.sa_restorer._0_4_ = atoi(*(char **)(endpoint._8_8_ + 0x20));
  _pid = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&pid,(sigaction *)0x0);
  i = 0;
  while( true ) {
    if ((int)sa.sa_restorer <= i) {
      return 0;
    }
    local_d0 = fork();
    if (local_d0 < 1) break;
    i = i + 1;
  }
  if (local_d0 < 0) {
    return 0;
  }
  for (co._4_4_ = 0; co._4_4_ < sa.sa_restorer._4_4_; co._4_4_ = co._4_4_ + 1) {
    local_e0 = (stCoRoutine_t *)0x0;
    co_create(&local_e0,(stCoRoutineAttr_t *)0x0,readwrite_routine,&proccnt);
    co_resume(local_e0);
  }
  ctx = co_get_epoll_ct();
  co_eventloop(ctx,(pfn_co_eventloop_t)0x0,(void *)0x0);
  exit(0);
}

Assistant:

int main(int argc,char *argv[])
{
	stEndPoint endpoint;
	endpoint.ip = argv[1];
	endpoint.port = atoi(argv[2]);
	int cnt = atoi( argv[3] );
	int proccnt = atoi( argv[4] );
	
	struct sigaction sa;
	sa.sa_handler = SIG_IGN;
	sigaction( SIGPIPE, &sa, NULL );
	
	for(int k=0;k<proccnt;k++)
	{

		pid_t pid = fork();
		if( pid > 0 )
		{
			continue;
		}
		else if( pid < 0 )
		{
			break;
		}
		for(int i=0;i<cnt;i++)
		{
			stCoRoutine_t *co = 0;
			co_create( &co,NULL,readwrite_routine, &endpoint);
			co_resume( co );
		}
		co_eventloop( co_get_epoll_ct(),0,0 );

		exit(0);
	}
	return 0;
}